

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O3

psa_status_t psa_get_key_slot(psa_key_handle_t handle,psa_key_slot_t **p_slot)

{
  psa_status_t pVar1;
  
  pVar1 = -0x89;
  if ((((global_data._1536_1_ & 1) != 0) && (pVar1 = -0x88, 0xffdf < (ushort)(handle - 0x21))) &&
     (global_data.key_slots[handle - 1].attr.type != 0)) {
    *p_slot = global_data.key_slots + (handle - 1);
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

psa_status_t psa_get_key_slot( psa_key_handle_t handle,
                               psa_key_slot_t **p_slot )
{
    psa_key_slot_t *slot = NULL;

    if( ! global_data.key_slots_initialized )
        return( PSA_ERROR_BAD_STATE );

    /* 0 is not a valid handle under any circumstance. This
     * implementation provides slots number 1 to N where N is the
     * number of available slots. */
    if( handle == 0 || handle > ARRAY_LENGTH( global_data.key_slots ) )
        return( PSA_ERROR_INVALID_HANDLE );
    slot = &global_data.key_slots[handle - 1];

    /* If the slot isn't occupied, the handle is invalid. */
    if( ! psa_is_key_slot_occupied( slot ) )
        return( PSA_ERROR_INVALID_HANDLE );

    *p_slot = slot;
    return( PSA_SUCCESS );
}